

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ParseContext::ParseMessage<google::protobuf::SourceContext>
          (ParseContext *this,SourceContext *msg,char *ptr)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  pair<const_char_*,_int> pVar6;
  
  bVar1 = *ptr;
  uVar4 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    pVar6 = ReadSizeFallback(ptr,(uint)bVar1);
    uVar4 = pVar6.second;
    pcVar5 = pVar6.first;
    if (pcVar5 == (char *)0x0) {
      return (char *)0x0;
    }
  }
  else {
    pcVar5 = ptr + 1;
  }
  iVar3 = EpsCopyInputStream::PushLimit(&this->super_EpsCopyInputStream,pcVar5,uVar4);
  iVar2 = this->depth_;
  this->depth_ = iVar2 + -1;
  if (((0 < iVar2) &&
      (pcVar5 = SourceContext::_InternalParse(msg,pcVar5,this), pcVar5 != (char *)0x0)) &&
     (this->depth_ = this->depth_ + 1, (this->super_EpsCopyInputStream).last_tag_minus_1_ == 0)) {
    uVar4 = iVar3 + (this->super_EpsCopyInputStream).limit_;
    (this->super_EpsCopyInputStream).limit_ = uVar4;
    (this->super_EpsCopyInputStream).limit_end_ =
         (this->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
    return pcVar5;
  }
  return (char *)0x0;
}

Assistant:

PROTOBUF_MUST_USE_RESULT const char* ParseContext::ParseMessage(
    T* msg, const char* ptr) {
  int size = ReadSize(&ptr);
  if (!ptr) return nullptr;
  auto old = PushLimit(ptr, size);
  if (--depth_ < 0) return nullptr;
  ptr = msg->_InternalParse(ptr, this);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  depth_++;
  if (!PopLimit(old)) return nullptr;
  return ptr;
}